

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcursor.cpp
# Opt level: O3

QDataStream * operator<<(QDataStream *s,QCursor *c)

{
  bool bVar1;
  QDataStream *stream;
  long in_FS_OFFSET;
  QPixmap QStack_68;
  QPixmap local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QCursorData::initialize();
  QDataStream::operator<<(s,(short)c->d->cshape);
  QCursorData::initialize();
  if (c->d->cshape != BitmapCursor) goto LAB_002bcf01;
  if (*(int *)(s + 0x18) < 7) {
LAB_002bce61:
    QCursor::bitmap((QBitmap *)&local_50,c);
    stream = operator<<(s,&local_50);
    QCursor::mask((QBitmap *)&QStack_68,c);
    operator<<(stream,&QStack_68);
    QBitmap::~QBitmap((QBitmap *)&QStack_68);
    QBitmap::~QBitmap((QBitmap *)&local_50);
  }
  else {
    QCursorData::initialize();
    QPixmap::QPixmap(&local_50,&c->d->pixmap);
    bVar1 = QPixmap::isNull(&local_50);
    QPixmap::~QPixmap(&local_50);
    QDataStream::operator<<(s,!bVar1);
    if (bVar1) goto LAB_002bce61;
    QCursorData::initialize();
    QPixmap::QPixmap(&local_50,&c->d->pixmap);
    operator<<(s,&local_50);
    QPixmap::~QPixmap(&local_50);
  }
  QCursorData::initialize();
  local_50.super_QPaintDevice._vptr_QPaintDevice =
       (_func_int **)(long)CONCAT24(c->d->hy,(int)c->d->hx);
  operator<<(s,(QPoint *)&local_50);
LAB_002bcf01:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator<<(QDataStream &s, const QCursor &c)
{
    s << (qint16)c.shape();                        // write shape id to stream
    if (c.shape() == Qt::BitmapCursor) {                // bitmap cursor
        bool isPixmap = false;
        if (s.version() >= 7) {
            isPixmap = !c.pixmap().isNull();
            s << isPixmap;
        }
        if (isPixmap)
            s << c.pixmap();
        else
            s << c.bitmap() << c.mask();
        s << c.hotSpot();
    }
    return s;
}